

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cpp
# Opt level: O0

void __thiscall Pipeline::Pipeline(Pipeline *this,Tetromino *transformee)

{
  vector<Transformation_*,_std::allocator<Transformation_*>_> *this_00;
  vector<Collidable_*,_std::allocator<Collidable_*>_> *this_01;
  Tetromino *transformee_local;
  Pipeline *this_local;
  
  this->transformee = transformee;
  this_00 = (vector<Transformation_*,_std::allocator<Transformation_*>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<Transformation_*,_std::allocator<Transformation_*>_>::vector(this_00);
  this->pipeline = this_00;
  this_01 = (vector<Collidable_*,_std::allocator<Collidable_*>_> *)operator_new(0x18);
  memset(this_01,0,0x18);
  std::vector<Collidable_*,_std::allocator<Collidable_*>_>::vector(this_01);
  this->collidables = this_01;
  return;
}

Assistant:

Pipeline::Pipeline(Tetromino* transformee) {
    this->transformee = transformee;
    this->pipeline = new vector<Transformation*>();
    this->collidables = new vector<Collidable*>();
}